

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O3

int EncodeStreamHook(void *input,void *data2)

{
  uint32_t color;
  code *pcVar1;
  WebPConfig *pWVar2;
  uint32_t *puVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint32_t *puVar10;
  ulong uVar11;
  VP8LHistogramSet *image_histo;
  VP8LHistogram *tmp_histo;
  HuffmanTreeToken *tokens;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  undefined8 extraout_RDX;
  HuffmanTree *pHVar16;
  ulong uVar17;
  HuffmanTreeCode *pHVar18;
  uint8_t *puVar19;
  byte bVar20;
  VP8LEncoderARGBContent VVar21;
  VP8LBitWriter *pVVar22;
  uint uVar23;
  ulong uVar24;
  vp8l_atype_t vVar25;
  long lVar26;
  WebPPicture *pWVar27;
  undefined8 uVar28;
  VP8LEncoder *pVVar29;
  int iVar30;
  HuffmanTreeCode *in_R9;
  uint32_t uVar31;
  int height;
  undefined1 uVar32;
  uint32_t uVar33;
  uint32_t *puVar34;
  bool bVar35;
  int percent;
  VP8LEncoder *local_1a00;
  uint32_t *local_19f8;
  ulong local_19f0;
  WebPPicture *local_19e8;
  ulong local_19e0;
  HuffmanTreeCode *local_19d8;
  uint32_t *local_19d0;
  HuffmanTree *local_19c8;
  uint local_19bc;
  HuffmanTreeCode *local_19b8;
  VP8LBitWriter *local_19b0;
  ulong local_19a8;
  int local_199c;
  uint32_t *local_1998;
  uint32_t *local_1990;
  long local_1988;
  ulong local_1980;
  ulong local_1978;
  uint local_196c;
  VP8LBackwardRefs *local_1968;
  VP8LHashChain *local_1960;
  uint local_1958;
  int local_1954;
  int local_1950;
  uint local_194c;
  long local_1948;
  ulong local_1940;
  uint8_t *local_1938;
  int local_1930;
  undefined4 local_192c;
  int local_1928;
  int local_1924;
  int local_1920;
  int cache_bits_best;
  ulong local_1918;
  void *local_1910;
  long local_1908;
  ulong local_1900;
  ulong local_18f8;
  long local_18f0;
  uint8_t *local_18e8;
  VP8LBackwardRefs *local_18e0;
  VP8LBackwardRefs *local_18d8;
  ulong local_18d0;
  uint32_t *local_18c8;
  long local_18c0;
  ulong local_18b8;
  VP8LBackwardRefs *local_18b0;
  long local_18a8;
  ulong local_18a0;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  uint32_t idx_map [256];
  VP8LHashChain hash_chain_histogram;
  uint16_t buffer [2048];
  
  local_1908 = *input;
  local_19e8 = *(WebPPicture **)((long)input + 8);
  local_19b0 = *(VP8LBitWriter **)((long)input + 0x10);
  local_1a00 = *(VP8LEncoder **)((long)input + 0x18);
  uVar23 = *(uint *)((long)input + 0x1a8);
  local_1920 = *(int *)((long)input + 0x1ac);
  local_18c0 = *(long *)((long)input + 0x1b0);
  local_1980 = (ulong)(uint)(int)*(float *)(local_1908 + 4);
  local_1924 = *(int *)(local_1908 + 8);
  local_19b8 = (HuffmanTreeCode *)0x0;
  bVar35 = local_1924 == 0;
  local_1928 = local_19e8->width;
  local_19a8 = (ulong)(uint)local_19e8->height;
  local_1948 = (long)local_19b0->cur_ - (long)local_19b0->buf_;
  iVar6 = local_19b0->used_;
  percent = 2;
  bw_init.bits_ = local_19b0->bits_;
  bw_init.used_ = local_19b0->used_;
  bw_init._12_4_ = *(undefined4 *)&local_19b0->field_0xc;
  bw_init.buf_ = local_19b0->buf_;
  bw_init.cur_ = local_19b0->cur_;
  bw_init.end_ = local_19b0->end_;
  bw_init.error_ = local_19b0->error_;
  bw_init._44_4_ = *(undefined4 *)&local_19b0->field_0x2c;
  local_1910 = input;
  iVar5 = VP8LBitWriterInit(&bw_best,0);
  pWVar27 = local_19e8;
  if (iVar5 == 0) {
LAB_0016ba67:
    WebPEncodingSetError(pWVar27,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    if ((int)uVar23 < 2) {
      if (uVar23 == 1) goto LAB_0016ba80;
    }
    else {
      iVar5 = VP8LBitWriterClone(local_19b0,&bw_best);
      pWVar27 = local_19e8;
      if (iVar5 == 0) goto LAB_0016ba67;
LAB_0016ba80:
      local_18a8 = (long)local_1910 + 0x20;
      local_19b8 = (HuffmanTreeCode *)CONCAT71((int7)((ulong)local_19b8 >> 8),bVar35);
      local_1948 = local_1948 + (ulong)(uint)(iVar6 + 7 >> 3);
      local_18d0 = 0x61 / (ulong)uVar23;
      local_1968 = local_1a00->refs_;
      local_18b0 = local_1a00->refs_ + 1;
      local_18c8 = local_1a00->palette_sorted_;
      local_1990 = local_1a00->palette_;
      local_196c = (uint)local_18d0;
      local_18d0 = local_18d0 >> 2;
      local_1960 = &local_1a00->hash_chain_;
      local_194c = local_196c - (int)local_18d0;
      local_199c = (int)local_19a8 + -1;
      local_18e0 = local_1a00->refs_ + 2;
      local_1938 = (uint8_t *)0xffffffffffffffff;
      uVar24 = 0;
      local_1954 = 0;
      local_1950 = 0;
      local_18b8 = (ulong)uVar23;
      do {
        pVVar29 = local_1a00;
        uVar23 = *(uint *)(local_18a8 + uVar24 * 0x1c);
        uVar15 = uVar23 & 0xfffffffe;
        uVar13 = (uint)(uVar23 == 5 || (uVar23 & 0xfffffffd) == 1);
        uVar23 = 0;
        if (local_1920 == 0) {
          uVar23 = uVar13;
        }
        lVar14 = local_18a8 + uVar24 * 0x1c;
        uVar28 = 0;
        if (uVar15 == 4) {
          uVar23 = 0;
        }
        local_1a00->use_palette_ = (uint)(uVar15 == 4);
        local_1a00->use_subtract_green_ = (uint)(uVar15 == 2);
        local_1a00->use_predict_ = uVar13;
        if (local_1924 == 0) {
          uVar23 = 0;
        }
        local_1a00->use_cross_color_ = uVar23;
        local_1a00->cache_bits_ = 0;
        local_18a0 = uVar24;
        VP8LBackwardRefsClear(local_1968);
        VP8LBackwardRefsClear(local_18b0);
        iVar6 = *(int *)(local_1908 + 0x5c);
        VVar21 = kEncoderNone;
        local_1988 = lVar14;
        if (iVar6 < 100) {
          if (pVVar29->use_palette_ != 0) {
            pVVar29->argb_content_ = kEncoderNone;
            goto LAB_0016bcbb;
          }
          if (pVVar29->use_predict_ == 0) {
            iVar5 = AllocateTransformBuffer(pVVar29,local_1928,(int)local_19a8);
            lVar14 = local_1988;
            pVVar29 = local_1a00;
            if (iVar5 != 0) {
              VVar21 = kEncoderNearLossless;
              if ((local_1a00->argb_content_ == kEncoderNearLossless) ||
                 (iVar5 = VP8ApplyNearLossless
                                    (local_19e8,*(int *)(local_1908 + 0x5c),local_1a00->argb_),
                 pWVar27 = local_19e8, iVar5 != 0)) goto LAB_0016bcac;
              goto LAB_0016ba67;
            }
            goto LAB_0016d147;
          }
          pVVar29->argb_content_ = kEncoderNone;
LAB_0016bfbc:
          pWVar27 = pVVar29->pic_;
          iVar6 = pWVar27->width;
          iVar12 = pWVar27->height;
          iVar8 = AllocateTransformBuffer(pVVar29,iVar6,iVar12);
          iVar5 = (int)uVar28;
          if (iVar8 == 0) goto LAB_0016d147;
          uVar24 = (ulong)local_196c;
          pVVar29 = local_1a00;
          if (local_1a00->argb_content_ == kEncoderARGB) goto LAB_0016c384;
          if (0 < iVar12) {
            puVar34 = pWVar27->argb;
            puVar10 = local_1a00->argb_;
            do {
              memcpy(puVar10,puVar34,(long)iVar6 * 4);
              iVar5 = (int)uVar28;
              puVar34 = puVar34 + pWVar27->argb_stride;
              puVar10 = puVar10 + iVar6;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          local_1a00->argb_content_ = kEncoderARGB;
          uVar23 = local_196c;
LAB_0016c381:
          uVar24 = (ulong)uVar23;
          pVVar29 = local_1a00;
        }
        else {
LAB_0016bcac:
          iVar5 = (int)uVar28;
          pVVar29->argb_content_ = VVar21;
          if (pVVar29->use_palette_ == 0) {
            uVar24 = (ulong)local_196c;
            if (99 < iVar6) goto LAB_0016bfbc;
          }
          else {
LAB_0016bcbb:
            iVar6 = PaletteSort(*(PaletteSorting *)(lVar14 + 4),pVVar29->pic_,local_18c8,
                                pVVar29->palette_size_,local_1990);
            pVVar22 = local_19b0;
            if (iVar6 == 0) {
              pWVar27 = pVVar29->pic_;
              goto LAB_0016ba67;
            }
            uVar23 = pVVar29->palette_size_;
            uVar13 = uVar23 - 1;
            if (pVVar29->palette_[(long)(int)uVar23 + -1] != 0) {
              uVar13 = uVar23;
            }
            if ((long)(int)uVar23 < 0x12) {
              uVar13 = uVar23;
            }
            uVar23 = local_19b0->used_;
            if (0x1f < (int)uVar23) {
              VP8LPutBitsFlushBits(local_19b0);
              uVar23 = pVVar22->used_;
            }
            uVar24 = pVVar22->bits_ | 1L << ((ulong)uVar23 & 0x3f);
            pVVar22->bits_ = uVar24;
            iVar6 = uVar23 + 1;
            pVVar22->used_ = iVar6;
            if (0x1e < (int)uVar23) {
              VP8LPutBitsFlushBits(pVVar22);
              iVar6 = pVVar22->used_;
              uVar24 = pVVar22->bits_;
            }
            uVar24 = 3L << ((byte)iVar6 & 0x3f) | uVar24;
            pVVar22->bits_ = uVar24;
            iVar5 = iVar6 + 2;
            pVVar22->used_ = iVar5;
            if (0x1d < iVar6) {
              VP8LPutBitsFlushBits(pVVar22);
              iVar5 = pVVar22->used_;
              uVar24 = pVVar22->bits_;
            }
            uVar23 = uVar13 - 1;
            pVVar22->bits_ = (ulong)uVar23 << ((byte)iVar5 & 0x3f) | uVar24;
            pVVar22->used_ = iVar5 + 8;
            uVar24 = (ulong)uVar23;
            if (0 < (int)uVar23) {
              do {
                *(uint32_t *)(buffer + uVar24 * 2) =
                     (local_1990[uVar24] | 0xff00) - (local_1990[uVar24 - 1] & 0xff00ff) & 0xff00ff
                     | (local_1990[uVar24] | 0xff0000) - (local_1990[uVar24 - 1] & 0xff00ff00) &
                       0xff00ff00;
                bVar35 = 1 < uVar24;
                uVar24 = uVar24 - 1;
              } while (bVar35);
            }
            buffer._0_4_ = local_1a00->palette_[0];
            pVVar29 = (VP8LEncoder *)(ulong)uVar13;
            in_R9 = (HuffmanTreeCode *)0x1;
            iVar6 = EncodeImageNoHuffman
                              (pVVar22,(uint32_t *)buffer,local_1960,local_1968,uVar13,1,0x14,
                               (int)local_19b8,local_1a00->pic_,(int)local_18d0,&percent);
            if (iVar6 == 0) goto LAB_0016d147;
            pWVar27 = local_1a00->pic_;
            uVar23 = pWVar27->width;
            pHVar16 = (HuffmanTree *)(long)(int)uVar23;
            uVar13 = local_1a00->palette_size_;
            local_19c8 = (HuffmanTree *)(ulong)uVar13;
            uVar15 = (uint)((int)uVar13 < 0x11);
            if ((int)uVar13 < 5) {
              uVar15 = (int)uVar13 < 3 | 2;
            }
            local_1998 = (uint32_t *)CONCAT44(local_1998._4_4_,uVar15);
            local_19e0 = CONCAT44(local_19e0._4_4_,pWVar27->height);
            iVar6 = AllocateTransformBuffer
                              (local_1a00,(uVar23 + (1 << (sbyte)uVar15)) - 1 >> (sbyte)uVar15,
                               pWVar27->height);
            if (iVar6 == 0) goto LAB_0016d147;
            puVar34 = pWVar27->argb;
            local_19f0 = (ulong)(uint)pWVar27->argb_stride;
            local_19d0 = local_1a00->argb_;
            local_1978 = (ulong)(uint)local_1a00->current_width_;
            puVar10 = (uint32_t *)WebPSafeMalloc((uint64_t)pHVar16,1);
            iVar5 = (int)pVVar29;
            if (puVar10 == (uint32_t *)0x0) {
              iVar6 = WebPEncodingSetError(pWVar27,VP8_ENC_ERROR_OUT_OF_MEMORY);
              if (iVar6 == 0) goto LAB_0016d147;
            }
            else {
              uVar24 = (ulong)uVar23;
              local_19f8 = puVar10;
              if ((int)local_19c8 < 4) {
                local_19c8 = pHVar16;
                if (0 < (int)local_19e0) {
                  uVar33 = *local_1990;
                  local_19f0 = local_19f0 << 2;
                  iVar6 = 0;
                  bVar20 = 0;
                  do {
                    puVar10 = local_19d0;
                    if (0 < (int)uVar23) {
                      uVar11 = 0;
                      do {
                        uVar31 = puVar34[uVar11];
                        if (uVar31 != uVar33) {
                          uVar33 = uVar31;
                          if (*local_1990 == uVar31) {
                            bVar20 = 0;
                          }
                          else {
                            bVar20 = 1;
                            if (local_1a00->palette_[1] != uVar31) {
                              bVar20 = local_1a00->palette_[2] == uVar31 ^ 3;
                            }
                          }
                        }
                        *(byte *)((long)local_19f8 + uVar11) = bVar20;
                        uVar11 = uVar11 + 1;
                        pVVar29 = local_1a00;
                      } while (uVar24 != uVar11);
                    }
                    (*VP8LBundleColorMap)
                              ((uint8_t *)local_19f8,(int)local_19c8,(int)local_1998,local_19d0);
                    iVar5 = (int)pVVar29;
                    local_19d0 = puVar10 + local_1978;
                    iVar6 = iVar6 + 1;
                    puVar34 = (uint32_t *)((long)puVar34 + local_19f0);
                  } while (iVar6 != (int)local_19e0);
                }
              }
              else {
                lVar14 = 0;
                do {
                  memset(buffer,0xff,0x1000);
                  pcVar1 = (code *)(&PTR_ApplyPaletteHash0_001a5d50)[lVar14];
                  pHVar16 = (HuffmanTree *)0x0;
                  while( true ) {
                    uVar13 = (*pcVar1)(local_1990[(long)pHVar16]);
                    puVar10 = local_1990;
                    iVar5 = (int)pVVar29;
                    if (buffer[uVar13] != 0xffff) break;
                    buffer[uVar13] = (uint16_t)pHVar16;
                    pHVar16 = (HuffmanTree *)((long)&pHVar16->total_count_ + 1);
                    if (local_19c8 == pHVar16) {
                      iVar6 = (int)lVar14;
                      if (iVar6 == 2) {
                        if (0 < (int)local_19e0) {
                          uVar13 = *local_1990;
                          local_19f0 = local_19f0 << 2;
                          uVar32 = 0;
                          iVar6 = 0;
                          puVar10 = local_19d0;
                          do {
                            if (0 < (int)uVar23) {
                              uVar11 = 0;
                              do {
                                uVar15 = puVar34[uVar11];
                                if (uVar15 != uVar13) {
                                  uVar32 = (undefined1)
                                           buffer[uVar15 * -0x80000000 - (uVar15 & 0xffffff) >> 0x15
                                                 ];
                                  uVar13 = uVar15;
                                }
                                *(undefined1 *)((long)local_19f8 + uVar11) = uVar32;
                                uVar11 = uVar11 + 1;
                              } while (uVar24 != uVar11);
                            }
                            (*VP8LBundleColorMap)
                                      ((uint8_t *)local_19f8,uVar23,(int)local_1998,puVar10);
                            iVar5 = (int)pVVar29;
                            puVar10 = puVar10 + local_1978;
                            iVar6 = iVar6 + 1;
                            puVar34 = (uint32_t *)((long)puVar34 + local_19f0);
                          } while (iVar6 != (int)local_19e0);
                        }
                        goto LAB_0016c341;
                      }
                      if (iVar6 == 1) {
                        if (0 < (int)local_19e0) {
                          uVar13 = *local_1990;
                          local_19f0 = local_19f0 << 2;
                          uVar32 = 0;
                          iVar6 = 0;
                          puVar10 = local_19d0;
                          do {
                            if (0 < (int)uVar23) {
                              uVar11 = 0;
                              do {
                                uVar15 = puVar34[uVar11];
                                if (uVar15 != uVar13) {
                                  uVar32 = (undefined1)
                                           buffer[(uVar15 & 0xffffff) * -0x455ab19 >> 0x15];
                                  uVar13 = uVar15;
                                }
                                *(undefined1 *)((long)local_19f8 + uVar11) = uVar32;
                                uVar11 = uVar11 + 1;
                              } while (uVar24 != uVar11);
                            }
                            (*VP8LBundleColorMap)
                                      ((uint8_t *)local_19f8,uVar23,(int)local_1998,puVar10);
                            iVar5 = (int)pVVar29;
                            puVar10 = puVar10 + local_1978;
                            iVar6 = iVar6 + 1;
                            puVar34 = (uint32_t *)((long)puVar34 + local_19f0);
                          } while (iVar6 != (int)local_19e0);
                        }
                      }
                      else {
                        if (iVar6 != 0) goto LAB_0016c153;
                        if (0 < (int)local_19e0) {
                          uVar13 = *local_1990;
                          local_19f0 = local_19f0 << 2;
                          uVar32 = 0;
                          iVar6 = 0;
                          puVar10 = local_19d0;
                          do {
                            if (0 < (int)uVar23) {
                              uVar11 = 0;
                              do {
                                uVar15 = puVar34[uVar11];
                                if (uVar15 != uVar13) {
                                  uVar32 = (undefined1)buffer[uVar15 >> 8 & 0xff];
                                  uVar13 = uVar15;
                                }
                                *(undefined1 *)((long)local_19f8 + uVar11) = uVar32;
                                uVar11 = uVar11 + 1;
                              } while (uVar24 != uVar11);
                            }
                            (*VP8LBundleColorMap)
                                      ((uint8_t *)local_19f8,uVar23,(int)local_1998,puVar10);
                            iVar5 = (int)pVVar29;
                            puVar10 = puVar10 + local_1978;
                            iVar6 = iVar6 + 1;
                            puVar34 = (uint32_t *)((long)puVar34 + local_19f0);
                          } while (iVar6 != (int)local_19e0);
                        }
                      }
                      goto LAB_0016c341;
                    }
                  }
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
LAB_0016c153:
                PrepareMapToPalette(local_1990,(uint32_t)local_19c8,
                                    (uint32_t *)&hash_chain_histogram,idx_map);
                iVar5 = (int)pVVar29;
                if (0 < (int)local_19e0) {
                  uVar33 = *puVar10;
                  local_19f0 = local_19f0 << 2;
                  uVar31 = 0;
                  iVar6 = 0;
                  do {
                    local_19d8 = (HuffmanTreeCode *)CONCAT44(local_19d8._4_4_,iVar6);
                    puVar10 = local_19f8;
                    if (0 < (int)uVar23) {
                      uVar11 = 0;
                      do {
                        color = puVar34[uVar11];
                        if (color != uVar33) {
                          iVar6 = SearchColorNoIdx((uint32_t *)&hash_chain_histogram,color,
                                                   (int)local_19c8);
                          uVar31 = idx_map[iVar6];
                          puVar10 = local_19f8;
                          uVar33 = color;
                        }
                        *(uint8_t *)((long)puVar10 + uVar11) = (uint8_t)uVar31;
                        uVar11 = uVar11 + 1;
                      } while (uVar24 != uVar11);
                    }
                    puVar3 = local_19d0;
                    (*VP8LBundleColorMap)((uint8_t *)puVar10,uVar23,(int)local_1998,local_19d0);
                    iVar5 = (int)pVVar29;
                    local_19d0 = puVar3 + local_1978;
                    iVar6 = (int)local_19d8 + 1;
                    puVar34 = (uint32_t *)((long)puVar34 + local_19f0);
                  } while (iVar6 != (int)local_19e0);
                }
              }
LAB_0016c341:
              WebPSafeFree(local_19f8);
            }
            local_1a00->argb_content_ = kEncoderPalette;
            uVar23 = local_1a00->palette_size_;
            uVar24 = (ulong)local_194c;
            pVVar29 = local_1a00;
            if ((int)uVar23 < 0x400) {
              uVar13 = 0x1f;
              if (uVar23 != 0) {
                for (; uVar23 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              local_1a00->cache_bits_ = (uVar13 ^ 0xffffffe0) + 0x21;
              uVar23 = local_194c;
              goto LAB_0016c381;
            }
          }
        }
LAB_0016c384:
        pVVar22 = local_19b0;
        if (pVVar29->use_subtract_green_ != 0) {
          iVar6 = pVVar29->current_width_;
          uVar23 = local_19b0->used_;
          if (0x1f < (int)uVar23) {
            VP8LPutBitsFlushBits(local_19b0);
            uVar23 = pVVar22->used_;
          }
          uVar11 = pVVar22->bits_ | 1L << ((ulong)uVar23 & 0x3f);
          pVVar22->bits_ = uVar11;
          iVar12 = uVar23 + 1;
          pVVar22->used_ = iVar12;
          if (0x1e < (int)uVar23) {
            VP8LPutBitsFlushBits(pVVar22);
            iVar12 = pVVar22->used_;
            uVar11 = pVVar22->bits_;
          }
          pVVar29 = local_1a00;
          pVVar22->bits_ = 2L << ((byte)iVar12 & 0x3f) | uVar11;
          pVVar22->used_ = iVar12 + 2;
          (*VP8LSubtractGreenFromBlueAndRed)(local_1a00->argb_,iVar6 * (int)local_19a8);
        }
        iVar6 = (int)in_R9;
        if (pVVar29->use_predict_ != 0) {
          iVar12 = 100;
          if (pVVar29->use_palette_ == 0) {
            iVar12 = pVVar29->config_->near_lossless;
          }
          local_19c8 = (HuffmanTree *)CONCAT44(local_19c8._4_4_,iVar12);
          iVar8 = pVVar29->current_width_;
          local_19f8 = (uint32_t *)CONCAT44(local_19f8._4_4_,pVVar29->use_subtract_green_);
          height = (int)local_19a8;
          local_19e0 = uVar24;
          iVar7 = ClampBits(iVar8,height,pVVar29->predictor_transform_bits_,0x4000,iVar5,iVar6);
          pWVar2 = pVVar29->config_;
          iVar30 = pWVar2->method;
          iVar12 = iVar30 * 2 + -8;
          if (iVar30 < 5) {
            iVar12 = 0;
          }
          iVar5 = ClampBits(iVar8,height,iVar7 - iVar12,0x4000,iVar5,iVar6);
          iVar6 = (int)uVar24 / 6;
          iVar5 = VP8LResidualImage(iVar8,height,iVar5,iVar7,(int)local_19b8,pVVar29->argb_,
                                    pVVar29->argb_scratch_,pVVar29->transform_data_,(int)local_19c8,
                                    pWVar2->exact,(int)local_19f8,pVVar29->pic_,iVar6,&percent,
                                    (int *)buffer);
          pVVar22 = local_19b0;
          if (iVar5 == 0) goto LAB_0016d147;
          iVar5 = local_19b0->used_;
          if (0x1f < iVar5) {
            VP8LPutBitsFlushBits(local_19b0);
            iVar5 = pVVar22->used_;
          }
          pVVar22->bits_ = pVVar22->bits_ | 1L << ((byte)iVar5 & 0x3f);
          iVar12 = iVar5 + 1;
          pVVar22->used_ = iVar12;
          if (0x1e < iVar5) {
            VP8LPutBitsFlushBits(pVVar22);
            iVar12 = pVVar22->used_;
          }
          iVar5 = iVar12 + 2;
          pVVar22->used_ = iVar5;
          uVar4 = buffer._0_4_;
          if (0x1d < iVar12) {
            VP8LPutBitsFlushBits(pVVar22);
            iVar5 = pVVar22->used_;
          }
          iVar12 = (int)uVar24 / 3;
          pVVar22->bits_ = pVVar22->bits_ | (ulong)(uVar4 - 2) << ((byte)iVar5 & 0x3f);
          bVar20 = (byte)buffer._0_4_;
          iVar30 = 1 << (bVar20 & 0x1f);
          pVVar22->used_ = iVar5 + 3;
          uVar23 = (uint)(iVar30 + local_199c) >> (bVar20 & 0x1f);
          in_R9 = (HuffmanTreeCode *)(ulong)uVar23;
          local_1a00->predictor_transform_bits_ = buffer._0_4_;
          iVar6 = EncodeImageNoHuffman
                            (pVVar22,local_1a00->transform_data_,local_1960,local_1968,
                             (iVar8 + iVar30) - 1U >> (bVar20 & 0x1f),uVar23,(int)local_1980,
                             (int)local_19b8,local_1a00->pic_,iVar12 - iVar6,&percent);
          if (iVar6 == 0) goto LAB_0016d147;
          uVar24 = (ulong)(uint)((int)local_19e0 - iVar12);
          pVVar22 = local_19b0;
          pVVar29 = local_1a00;
        }
        if (pVVar29->use_cross_color_ != 0) {
          iVar6 = pVVar29->current_width_;
          iVar5 = (int)uVar24;
          iVar12 = iVar5 + 3;
          if (-1 < iVar5) {
            iVar12 = iVar5;
          }
          iVar8 = VP8LColorSpaceTransform
                            (iVar6,(int)local_19a8,pVVar29->cross_color_transform_bits_,
                             (int)local_1980,pVVar29->argb_,pVVar29->transform_data_,pVVar29->pic_,
                             iVar12 >> 2,&percent,(int *)buffer);
          if (iVar8 == 0) goto LAB_0016d147;
          uVar23 = pVVar22->used_;
          if (0x1f < (int)uVar23) {
            VP8LPutBitsFlushBits(pVVar22);
            uVar23 = pVVar22->used_;
          }
          vVar25 = pVVar22->bits_ | 1L << ((ulong)uVar23 & 0x3f);
          pVVar22->bits_ = vVar25;
          uVar13 = uVar23 + 1;
          pVVar22->used_ = uVar13;
          if (0x1e < (int)uVar23) {
            VP8LPutBitsFlushBits(pVVar22);
            uVar13 = pVVar22->used_;
            vVar25 = pVVar22->bits_;
          }
          vVar25 = vVar25 | 1L << ((ulong)uVar13 & 0x3f);
          pVVar22->bits_ = vVar25;
          iVar8 = uVar13 + 2;
          pVVar22->used_ = iVar8;
          uVar4 = buffer._0_4_;
          if (0x1d < (int)uVar13) {
            VP8LPutBitsFlushBits(pVVar22);
            iVar8 = pVVar22->used_;
            vVar25 = pVVar22->bits_;
          }
          iVar30 = (int)(uVar24 >> 0x1f) + iVar5 >> 1;
          pVVar22->bits_ = (ulong)(uVar4 - 2) << ((byte)iVar8 & 0x3f) | vVar25;
          bVar20 = (byte)buffer._0_4_;
          iVar7 = 1 << (bVar20 & 0x1f);
          pVVar22->used_ = iVar8 + 3;
          uVar23 = (uint)(iVar7 + local_199c) >> (bVar20 & 0x1f);
          in_R9 = (HuffmanTreeCode *)(ulong)uVar23;
          local_1a00->cross_color_transform_bits_ = buffer._0_4_;
          iVar6 = EncodeImageNoHuffman
                            (pVVar22,local_1a00->transform_data_,local_1960,local_1968,
                             (iVar6 + iVar7) - 1U >> (bVar20 & 0x1f),uVar23,(int)local_1980,
                             (int)local_19b8,local_1a00->pic_,iVar30 - (iVar12 >> 2),&percent);
          if (iVar6 == 0) goto LAB_0016d147;
          uVar24 = (ulong)(uint)(iVar5 - iVar30);
          pVVar22 = local_19b0;
          pVVar29 = local_1a00;
        }
        iVar6 = pVVar22->used_;
        if (0x1f < iVar6) {
          VP8LPutBitsFlushBits(pVVar22);
          iVar6 = pVVar22->used_;
        }
        pVVar22->used_ = iVar6 + 1;
        uVar23 = pVVar29->histo_bits_;
        bVar20 = (byte)uVar23;
        iVar6 = 1 << (bVar20 & 0x1f);
        local_19d0 = (uint32_t *)(ulong)(uint)pVVar29->current_width_;
        local_1998 = pVVar29->argb_;
        uVar13 = ((uint)(iVar6 + local_199c) >> (bVar20 & 0x1f)) *
                 ((pVVar29->current_width_ + iVar6) - 1U >> (bVar20 & 0x1f));
        uVar11 = (ulong)uVar13;
        local_1978 = CONCAT44(local_1978._4_4_,percent);
        pHVar16 = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
        puVar34 = (uint32_t *)WebPSafeMalloc(uVar11,4);
        buffer._0_8_ = pVVar22->bits_;
        buffer._8_8_ = *(undefined8 *)&pVVar22->used_;
        buffer._16_8_ = pVVar22->buf_;
        buffer._24_8_ = pVVar22->cur_;
        buffer._32_8_ = pVVar22->end_;
        buffer._40_8_ = *(undefined8 *)&pVVar22->error_;
        hash_chain_histogram.offset_length_ = (uint32_t *)0x0;
        hash_chain_histogram.size_ = 0;
        hash_chain_histogram._12_4_ = 0;
        iVar6 = VP8LBitWriterInit((VP8LBitWriter *)idx_map,0);
        local_19f8 = puVar34;
        local_19c8 = pHVar16;
        if ((((iVar6 == 0) || (pHVar16 == (HuffmanTree *)0x0)) || (puVar34 == (uint32_t *)0x0)) ||
           (iVar6 = VP8LHashChainInit(&hash_chain_histogram,uVar13), iVar6 == 0)) {
LAB_0016cf32:
          WebPEncodingSetError(local_19e8,VP8_ENC_ERROR_OUT_OF_MEMORY);
        }
        else {
          iVar6 = (int)uVar24 / 5;
          in_R9 = local_19b8;
          iVar5 = VP8LHashChainFill(local_1960,(int)local_1980,local_1998,(int)local_19d0,
                                    (int)local_19a8,(int)local_19b8,local_19e8,iVar6,&percent);
          if (iVar5 != 0) {
            uVar15 = local_1a00->cache_bits_;
            if (local_1a00->cache_bits_ == 0) {
              uVar15 = 10;
            }
            local_18f8 = (ulong)uVar15;
            uVar15 = *(uint *)(local_1988 + 0x18);
            if ((1 < (int)uVar15) || (*(int *)(local_1988 + 0xc) != 0)) {
              iVar5 = VP8LBitWriterClone(pVVar22,(VP8LBitWriter *)idx_map);
              if (iVar5 == 0) goto LAB_0016cf32;
              uVar15 = *(uint *)(local_1988 + 0x18);
            }
            uVar17 = (ulong)uVar15;
            if (0 < (int)uVar15) {
              local_1900 = (ulong)((int)local_19d0 - 1);
              local_1930 = (int)uVar24 - iVar6;
              local_1918 = 0xffffffffffffffff;
              lVar14 = 0;
              local_19e0 = uVar24;
              local_1958 = uVar23;
              do {
                uVar9 = local_1930 / (int)uVar17;
                local_19f0 = (ulong)uVar9;
                uVar15 = uVar9 + 3;
                if (-1 < (int)uVar9) {
                  uVar15 = uVar9;
                }
                uVar9 = *(uint *)(local_1988 + 8 + lVar14 * 8);
                in_R9 = (HuffmanTreeCode *)(ulong)uVar9;
                iVar6 = VP8LGetBackwardReferences
                                  ((int)local_19d0,(int)local_19a8,local_1998,(int)local_1980,
                                   (int)local_19b8,uVar9,(int)local_18f8,
                                   *(int *)(local_1988 + 0xc + lVar14 * 8),local_1960,local_1968,
                                   &cache_bits_best,local_19e8,(int)uVar15 >> 2,&percent);
                if (iVar6 == 0) {
                  tokens = (HuffmanTreeToken *)0x0;
                  local_19d8 = (HuffmanTreeCode *)0x0;
LAB_0016d125:
                  tmp_histo = (VP8LHistogram *)0x0;
                  image_histo = (VP8LHistogramSet *)0x0;
                  pHVar18 = local_19d8;
                  goto LAB_0016cf4c;
                }
                local_19f0 = (ulong)(uint)((int)local_19f0 - ((int)uVar15 >> 2));
                uVar28 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
                bVar20 = 0;
                lVar26 = 0;
                local_18f0 = lVar14;
                do {
                  uVar17 = 0;
                  if ((char)uVar28 != '\0') {
                    uVar17 = (ulong)(uint)cache_bits_best;
                  }
                  local_19bc = uVar23;
                  if ((bool)(bVar20 & cache_bits_best == 0)) break;
                  local_192c = (undefined4)uVar28;
                  local_19d8 = (HuffmanTreeCode *)lVar26;
                  VP8LBitWriterReset((VP8LBitWriter *)buffer,pVVar22);
                  image_histo = VP8LAllocateHistogramSet(uVar13,(int)uVar17);
                  local_1940 = uVar17;
                  tmp_histo = VP8LAllocateHistogram((int)uVar17);
                  if ((image_histo == (VP8LHistogramSet *)0x0) ||
                     (tmp_histo == (VP8LHistogram *)0x0)) {
LAB_0016d0e1:
                    local_19d8 = (HuffmanTreeCode *)0x0;
LAB_0016d100:
                    WebPEncodingSetError(local_19e8,VP8_ENC_ERROR_OUT_OF_MEMORY);
                    tokens = (HuffmanTreeToken *)0x0;
                    pHVar18 = local_19d8;
                    goto LAB_0016cf4c;
                  }
                  iVar5 = (int)local_19f0 / 3;
                  local_18d8 = local_1968 + (long)local_19d8;
                  in_R9 = (HuffmanTreeCode *)(ulong)local_19bc;
                  iVar6 = (int)local_19d0;
                  iVar12 = VP8LGetHistoImageSymbols
                                     (iVar6,(int)local_19a8,local_18d8,(int)local_1980,
                                      (int)local_19b8,local_19bc,(int)local_1940,image_histo,
                                      tmp_histo,local_19f8,local_19e8,iVar5,&percent);
                  if (iVar12 == 0) {
                    tokens = (HuffmanTreeToken *)0x0;
                    local_19d8 = (HuffmanTreeCode *)0x0;
                    pHVar18 = local_19d8;
                    goto LAB_0016cf4c;
                  }
                  local_19d8 = (HuffmanTreeCode *)
                               WebPSafeCalloc((ulong)(uint)(image_histo->size * 5),0x18);
                  if (local_19d8 == (HuffmanTreeCode *)0x0) goto LAB_0016d0e1;
                  iVar12 = GetHuffBitLengthsAndCodes(image_histo,local_19d8);
                  if (iVar12 == 0) goto LAB_0016d100;
                  VP8LFreeHistogramSet(image_histo);
                  VP8LFreeHistogram(tmp_histo);
                  uVar24 = local_1940;
                  puVar34 = local_19f8;
                  uVar23 = pVVar22->used_;
                  if ((int)local_1940 < 1) {
                    if (0x1f < (int)uVar23) {
                      VP8LPutBitsFlushBits(pVVar22);
                      uVar23 = pVVar22->used_;
                    }
                    iVar12 = uVar23 + 1;
                  }
                  else {
                    if (0x1f < (int)uVar23) {
                      VP8LPutBitsFlushBits(pVVar22);
                      uVar23 = pVVar22->used_;
                    }
                    uVar17 = pVVar22->bits_ | 1L << ((ulong)uVar23 & 0x3f);
                    pVVar22->bits_ = uVar17;
                    iVar12 = uVar23 + 1;
                    pVVar22->used_ = iVar12;
                    if (0x1e < (int)uVar23) {
                      VP8LPutBitsFlushBits(pVVar22);
                      iVar12 = pVVar22->used_;
                      uVar17 = pVVar22->bits_;
                    }
                    pVVar22->bits_ = (uVar24 & 0xffffffff) << ((byte)iVar12 & 0x3f) | uVar17;
                    iVar12 = iVar12 + 4;
                  }
                  pVVar22->used_ = iVar12;
                  if (uVar11 == 0) {
                    uVar23 = 0;
                  }
                  else {
                    uVar24 = 0;
                    uVar15 = 0;
                    do {
                      uVar9 = puVar34[uVar24];
                      uVar23 = uVar9 + 1;
                      if (uVar9 < uVar15) {
                        uVar23 = uVar15;
                      }
                      puVar34[uVar24] = uVar9 << 8;
                      uVar24 = uVar24 + 1;
                      uVar15 = uVar23;
                    } while (uVar11 != uVar24);
                    iVar12 = pVVar22->used_;
                  }
                  if (0x1f < iVar12) {
                    VP8LPutBitsFlushBits(pVVar22);
                    iVar12 = pVVar22->used_;
                  }
                  uVar24 = (ulong)(uint)((int)local_19f0 - iVar5);
                  pVVar22->bits_ = pVVar22->bits_ | (ulong)(1 < uVar23) << ((byte)iVar12 & 0x3f);
                  pVVar22->used_ = iVar12 + 1;
                  local_19f0 = uVar24;
                  if (uVar23 < 2) {
                    if (uVar23 != 0) goto LAB_0016cd07;
                    tokens = (HuffmanTreeToken *)WebPSafeMalloc(0,2);
                    if (tokens == (HuffmanTreeToken *)0x0) goto LAB_0016d0fa;
                  }
                  else {
                    VP8LOptimizeSampling
                              (puVar34,iVar6,(int)local_19a8,local_1958,9,(int *)&local_19bc);
                    uVar15 = local_19bc;
                    iVar6 = pVVar22->used_;
                    if (0x1f < iVar6) {
                      VP8LPutBitsFlushBits(pVVar22);
                      iVar6 = pVVar22->used_;
                    }
                    pVVar22->bits_ = pVVar22->bits_ | (ulong)(uVar15 - 2) << ((byte)iVar6 & 0x3f);
                    pVVar22->used_ = iVar6 + 3;
                    iVar5 = (int)local_19f0;
                    bVar20 = (byte)local_19bc;
                    iVar6 = 1 << (bVar20 & 0x1f);
                    iVar12 = (int)(((uint)(local_19f0 >> 0x1f) & 1) + iVar5) >> 1;
                    uVar15 = (uint)(iVar6 + local_199c) >> (bVar20 & 0x1f);
                    in_R9 = (HuffmanTreeCode *)(ulong)uVar15;
                    iVar6 = EncodeImageNoHuffman
                                      (pVVar22,local_19f8,&hash_chain_histogram,local_18e0,
                                       (uint)(iVar6 + (int)local_1900) >> (bVar20 & 0x1f),uVar15,
                                       (int)local_1980,(int)local_19b8,local_19e8,iVar12,&percent);
                    if (iVar6 == 0) {
                      tokens = (HuffmanTreeToken *)0x0;
                      goto LAB_0016d125;
                    }
                    uVar24 = (ulong)(uint)(iVar5 - iVar12);
LAB_0016cd07:
                    pHVar18 = local_19d8;
                    uVar17 = (ulong)(uVar23 * 5 + (uint)(uVar23 * 5 == 0));
                    lVar14 = 0;
                    uVar23 = 0;
                    do {
                      uVar15 = *(uint *)((long)&local_19d8->num_symbols + lVar14);
                      if ((int)uVar15 < (int)uVar23) {
                        uVar15 = uVar23;
                      }
                      uVar23 = uVar15;
                      lVar14 = lVar14 + 0x18;
                    } while (uVar17 * 0x18 != lVar14);
                    tokens = (HuffmanTreeToken *)WebPSafeMalloc((ulong)uVar23,2);
                    pHVar16 = local_19c8;
                    if (tokens == (HuffmanTreeToken *)0x0) {
LAB_0016d0fa:
                      tmp_histo = (VP8LHistogram *)0x0;
                      image_histo = (VP8LHistogramSet *)0x0;
                      goto LAB_0016d100;
                    }
                    do {
                      local_19f0 = uVar24;
                      StoreHuffmanCode(pVVar22,pHVar16,tokens,pHVar18);
                      ClearHuffmanTreeIfOnlyOneSymbol(pHVar18);
                      pHVar18 = pHVar18 + 1;
                      uVar17 = uVar17 - 1;
                      uVar24 = local_19f0;
                    } while (uVar17 != 0);
                    iVar6 = (int)local_19d0;
                    puVar34 = local_19f8;
                  }
                  local_18e8 = pVVar22->cur_;
                  iVar5 = pVVar22->used_;
                  puVar19 = pVVar22->buf_;
                  iVar12 = (int)local_1948;
                  in_R9 = local_19d8;
                  iVar6 = StoreImageToBitMask(pVVar22,iVar6,local_19bc,local_18d8,puVar34,local_19d8
                                              ,local_19e8);
                  if (iVar6 == 0) goto LAB_0016d125;
                  lVar14 = (long)pVVar22->cur_ - (long)pVVar22->buf_;
                  uVar24 = (pVVar22->used_ + 7 >> 3) + lVar14;
                  if (uVar24 < local_1918) {
                    iVar12 = ((int)local_18e8 - ((int)puVar19 + iVar12)) + (iVar5 + 7 >> 3);
                    local_1a00->cache_bits_ = (int)local_1940;
                    iVar6 = local_19b0->used_;
                    iVar5 = (int)local_1948;
                    VP8LBitWriterSwap(local_19b0,(VP8LBitWriter *)idx_map);
                    local_1954 = ((int)lVar14 - (iVar5 + iVar12)) + (iVar6 + 7 >> 3);
                    local_1950 = iVar12;
                    local_1918 = uVar24;
                  }
                  WebPSafeFree(tokens);
                  pHVar18 = local_19d8;
                  WebPSafeFree(local_19d8->codes);
                  WebPSafeFree(pHVar18);
                  lVar26 = 1;
                  bVar20 = 1;
                  uVar28 = 0;
                  pVVar22 = local_19b0;
                  uVar24 = local_19e0;
                  uVar23 = local_1958;
                } while (((byte)local_192c & *(int *)(local_1988 + 0xc + local_18f0 * 8) != 0) != 0)
                ;
                lVar14 = local_18f0 + 1;
                uVar17 = (ulong)*(int *)(local_1988 + 0x18);
              } while (lVar14 < (long)uVar17);
            }
            VP8LBitWriterSwap(pVVar22,(VP8LBitWriter *)idx_map);
            WebPReportProgress(local_19e8,(int)local_1978 + (int)uVar24,&percent);
          }
        }
        tokens = (HuffmanTreeToken *)0x0;
        tmp_histo = (VP8LHistogram *)0x0;
        image_histo = (VP8LHistogramSet *)0x0;
        pHVar18 = (HuffmanTreeCode *)0x0;
LAB_0016cf4c:
        WebPSafeFree(tokens);
        WebPSafeFree(local_19c8);
        VP8LFreeHistogramSet(image_histo);
        VP8LFreeHistogram(tmp_histo);
        VP8LHashChainClear(&hash_chain_histogram);
        if (pHVar18 != (HuffmanTreeCode *)0x0) {
          WebPSafeFree(pHVar18->codes);
          WebPSafeFree(pHVar18);
        }
        WebPSafeFree(local_19f8);
        VP8LBitWriterWipeOut((VP8LBitWriter *)idx_map);
        uVar11 = local_18b8;
        pVVar22 = local_19b0;
        if (local_19e8->error_code != VP8_ENC_OK) goto LAB_0016d147;
        puVar19 = local_19b0->cur_ + ((long)(local_19b0->used_ + 7 >> 3) - (long)local_19b0->buf_);
        if ((puVar19 < local_1938) &&
           (VP8LBitWriterSwap(local_19b0,&bw_best), local_1938 = puVar19, local_18c0 != 0)) {
          uVar23 = (uint)(local_1a00->use_predict_ != 0);
          *(uint *)(local_18c0 + 0x94) = uVar23;
          if (local_1a00->use_cross_color_ != 0) {
            uVar23 = uVar23 | 2;
            *(uint *)(local_18c0 + 0x94) = uVar23;
          }
          if (local_1a00->use_subtract_green_ != 0) {
            uVar23 = uVar23 | 4;
            *(uint *)(local_18c0 + 0x94) = uVar23;
          }
          if (local_1a00->use_palette_ != 0) {
            *(uint *)(local_18c0 + 0x94) = uVar23 | 8;
          }
          *(undefined8 *)(local_18c0 + 0x98) = *(undefined8 *)&local_1a00->histo_bits_;
          *(int *)(local_18c0 + 0xb4) = local_1a00->cross_color_transform_bits_;
          *(int *)(local_18c0 + 0xa0) = local_1a00->cache_bits_;
          *(int *)(local_18c0 + 0xa4) = local_1a00->palette_size_;
          *(int *)(local_18c0 + 0xa8) = (int)puVar19 - (int)local_1948;
          *(int *)(local_18c0 + 0xac) = local_1950;
          *(int *)(local_18c0 + 0xb0) = local_1954;
        }
        if (1 < (int)uVar11) {
          VP8LBitWriterReset(&bw_init,pVVar22);
        }
        uVar24 = local_18a0 + 1;
      } while (uVar24 != uVar11);
    }
    VP8LBitWriterSwap(&bw_best,local_19b0);
  }
LAB_0016d147:
  VP8LBitWriterWipeOut(&bw_best);
  return (int)(*(int *)(*(long *)((long)local_1910 + 8) + 0x88) == 0);
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config_;
  const WebPPicture* const picture = params->picture_;
  VP8LBitWriter* const bw = params->bw_;
  VP8LEncoder* const enc = params->enc_;
  const CrunchConfig* const crunch_configs = params->crunch_configs_;
  const int num_crunch_configs = params->num_crunch_configs_;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero_;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats_;
#endif
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
  int percent = 2;  // for WebPProgressHook
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx_;
    int remaining_percent = 97 / num_crunch_configs, percent_range;
    enc->use_palette_ =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green_ =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict_ = (entropy_idx == kSpatial) ||
                        (entropy_idx == kSpatialSubGreen) ||
                        (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette_) {
      enc->use_cross_color_ = 0;
    } else {
      enc->use_cross_color_ = red_and_blue_always_zero ? 0 : enc->use_predict_;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits_ = 0;
    VP8LBackwardRefsClear(&enc->refs_[0]);
    VP8LBackwardRefsClear(&enc->refs_[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette_ &&
                        !enc->use_predict_;
    if (use_near_lossless) {
      if (!AllocateTransformBuffer(enc, width, height)) goto Error;
      if ((enc->argb_content_ != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb_)) {
        WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      enc->argb_content_ = kEncoderNearLossless;
    } else {
      enc->argb_content_ = kEncoderNone;
    }
#else
    enc->argb_content_ = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette_) {
      if (!PaletteSort(crunch_configs[idx].palette_sorting_type_, enc->pic_,
                       enc->palette_sorted_, enc->palette_size_,
                       enc->palette_)) {
        WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      percent_range = remaining_percent / 4;
      if (!EncodePalette(bw, low_effort, enc, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
      if (!MapImageFromPalette(enc)) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (enc->palette_size_ < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits_ = BitsLog2Floor(enc->palette_size_) + 1;
      }
    }
    // In case image is not packed.
    if (enc->argb_content_ != kEncoderNearLossless &&
        enc->argb_content_ != kEncoderPalette) {
      if (!MakeInputImageCopy(enc)) goto Error;
    }

    // -------------------------------------------------------------------------
    // Apply transforms and write transform data.

    if (enc->use_subtract_green_) {
      ApplySubtractGreen(enc, enc->current_width_, height, bw);
    }

    if (enc->use_predict_) {
      percent_range = remaining_percent / 3;
      if (!ApplyPredictFilter(enc, enc->current_width_, height, quality,
                              low_effort, enc->use_subtract_green_, bw,
                              percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    if (enc->use_cross_color_) {
      percent_range = remaining_percent / 2;
      if (!ApplyCrossColorFilter(enc, enc->current_width_, height, quality,
                                 low_effort, bw, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    if (!EncodeImageInternal(
            bw, enc->argb_, &enc->hash_chain_, enc->refs_, enc->current_width_,
            height, quality, low_effort, &crunch_configs[idx],
            &enc->cache_bits_, enc->histo_bits_, byte_position, &hdr_size,
            &data_size, picture, remaining_percent, &percent)) {
      goto Error;
    }

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict_) stats->lossless_features |= 1;
        if (enc->use_cross_color_) stats->lossless_features |= 2;
        if (enc->use_subtract_green_) stats->lossless_features |= 4;
        if (enc->use_palette_) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits_;
        stats->transform_bits = enc->predictor_transform_bits_;
        stats->cross_color_transform_bits = enc->cross_color_transform_bits_;
        stats->cache_bits = enc->cache_bits_;
        stats->palette_size = enc->palette_size_;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

 Error:
  VP8LBitWriterWipeOut(&bw_best);
  // The hook should return false in case of error.
  return (params->picture_->error_code == VP8_ENC_OK);
}